

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall clask::server_t::run(server_t *this,string *addr)

{
  long lVar1;
  int port;
  runtime_error *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> host;
  
  lVar1 = std::__cxx11::string::rfind((char)addr,0x3a);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&host,(ulong)addr);
    std::__cxx11::string::substr((ulong)&local_60,(ulong)addr);
    port = std::__cxx11::stoi(&local_60,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_60);
    _run(this,&host,port);
    std::__cxx11::string::~string((string *)&host);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid host:port");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void server_t::run(const std::string& addr) {
  auto pos = addr.find_last_of(':');
  if (pos == std::string::npos) {
    throw std::runtime_error("invalid host:port");
  }
  auto host = addr.substr(0, pos);
  auto port = std::stoi(addr.substr(pos + 1));
  _run(host, port);
}